

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.h
# Opt level: O3

void block_write_file<unsigned_char,r_file>(uchar *p,size_t size,r_file *f,size_t blockSize)

{
  ulong __n;
  size_t sVar1;
  runtime_error *this;
  
  if (blockSize <= size) {
    __n = size / blockSize;
    size = size % blockSize;
    do {
      sVar1 = fwrite(p,blockSize,__n,(FILE *)f->_f);
      if (sVar1 == 0) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"Unable to write to file.");
        goto LAB_00109ab4;
      }
      p = p + sVar1 * blockSize;
      __n = __n - sVar1;
    } while (__n != 0);
  }
  while( true ) {
    if (size == 0) {
      return;
    }
    sVar1 = fwrite(p,1,size,(FILE *)f->_f);
    if (sVar1 == 0) break;
    p = p + sVar1;
    size = size - sVar1;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Could not write to file.");
LAB_00109ab4:
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void block_write_file(const T* p, size_t size, const F& f, size_t blockSize = 4096)
{
    size_t blocks = (size >= blockSize)?size / blockSize:0;
    size_t remainder = (size >= blockSize)?size % blockSize:size;
    const uint8_t* writeHead = (const uint8_t*)p;

    while(blocks > 0)
    {
        auto blocksWritten = fwrite((void*)writeHead, blockSize, blocks, f);
        if(blocksWritten == 0)
            throw std::runtime_error("Unable to write to file.");
        blocks -= blocksWritten;
        writeHead += (blocksWritten * blockSize);
    }

    while(remainder > 0)
    {
        auto bytesWritten = fwrite((void*)writeHead, 1, remainder, f);
        if(bytesWritten == 0)
            throw std::runtime_error("Could not write to file.");
        remainder -= bytesWritten;
        writeHead += bytesWritten;
    }
}